

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

Instr * __thiscall
Lowerer::LowerBinaryHelperMemWithTemp(Lowerer *this,Instr *instr,JnHelperMethod helperMethod)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  IntConstOpnd *opndArg;
  Opnd *tempOpnd;
  Instr *instrFirst;
  Instr *pIStack_18;
  JnHelperMethod helperMethod_local;
  Instr *instr_local;
  Lowerer *this_local;
  
  instrFirst._4_4_ = helperMethod;
  pIStack_18 = instr;
  instr_local = (Instr *)this;
  instrFirst._0_4_ = Js::OpCodeUtil::GetOpCodeLayout(instr->m_opcode);
  bVar2 = Js::OpLayoutType::operator==((OpLayoutType *)&instrFirst,Reg3);
  if (((bVar2 ^ 0xffU) & 1) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x226e,
                       "(Js::OpCodeUtil::GetOpCodeLayout(instr->m_opcode) == Js::OpLayoutType::Reg3)"
                       ,"Expected a binary instruction...");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  if ((*(ushort *)&pIStack_18->field_0x36 >> 1 & 1) == 0) {
    opndArg = IR::IntConstOpnd::New(0,TyInt32,this->m_func,false);
    tempOpnd = (Opnd *)LowererMD::LoadHelperArgument
                                 (&this->m_lowererMD,pIStack_18,&opndArg->super_Opnd);
  }
  else {
    tempOpnd = (Opnd *)LoadHelperTemp(this,pIStack_18,pIStack_18);
  }
  LowerBinaryHelperMem(this,pIStack_18,instrFirst._4_4_);
  return (Instr *)tempOpnd;
}

Assistant:

IR::Instr *
Lowerer::LowerBinaryHelperMemWithTemp(IR::Instr *instr, IR::JnHelperMethod helperMethod)
{
    AssertMsg(Js::OpCodeUtil::GetOpCodeLayout(instr->m_opcode) == Js::OpLayoutType::Reg3, "Expected a binary instruction...");

    IR::Instr * instrFirst;
    IR::Opnd * tempOpnd;

    if (instr->dstIsTempNumber)
    {
        instrFirst = this->LoadHelperTemp(instr, instr);
    }
    else
    {
        tempOpnd = IR::IntConstOpnd::New(0, TyInt32, this->m_func);
        instrFirst = m_lowererMD.LoadHelperArgument(instr, tempOpnd);
    }

    this->LowerBinaryHelperMem(instr, helperMethod);

    return instrFirst;
}